

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_fetch<EasyUseHashMap<HashObject<8,8>,int,HashFn>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  bool bVar1;
  mapped_type *pmVar2;
  double in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_EDI;
  double ut;
  int i;
  int r;
  Rusage t;
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  key_type *in_stack_ffffffffffffff48;
  _Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true> in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  _Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true> local_90 [2];
  _Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true> local_80 [2];
  int local_6c;
  uint local_68;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseHashMap
            ((EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> *)0x1d9a78);
  Rusage::Rusage((Rusage *)in_stack_ffffffffffffff50._M_cur);
  for (local_6c = 0; local_6c < in_EDI; local_6c = local_6c + 1) {
    in_stack_ffffffffffffff64 = local_6c + 1;
    HashObject<8,_8>::HashObject
              ((HashObject<8,_8> *)in_stack_ffffffffffffff50._M_cur,
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    pmVar2 = std::
             unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
             ::operator[]((unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                           *)in_stack_ffffffffffffff50._M_cur,in_stack_ffffffffffffff48);
    *pmVar2 = in_stack_ffffffffffffff64;
  }
  local_68 = 1;
  Rusage::Reset((Rusage *)in_stack_ffffffffffffff50._M_cur);
  for (local_6c = 0; local_6c < in_EDI; local_6c = local_6c + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_6c);
    HashObject<8,_8>::HashObject
              ((HashObject<8,_8> *)in_stack_ffffffffffffff50._M_cur,
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    in_stack_ffffffffffffff50._M_cur =
         (__node_type *)
         std::
         unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
         ::find((unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                 *)in_stack_ffffffffffffff48,(key_type *)0x1d9b52);
    local_80[0]._M_cur = in_stack_ffffffffffffff50._M_cur;
    local_90[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
         ::end((unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                *)in_stack_ffffffffffffff48);
    bVar1 = std::__detail::operator!=(local_80,local_90);
    local_68 = bVar1 ^ local_68;
  }
  Rusage::UserTime((Rusage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  srand(local_68);
  report((char *)in_RSI,in_RDX,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
         in_stack_ffffffffffffffd0);
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn>::~EasyUseHashMap
            ((EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> *)0x1d9bf0);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}